

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::dump
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this,FastString *out,int indent)

{
  uchar uVar1;
  String local_70;
  String local_60;
  String local_50 [2];
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  MQTTStringPrintf((char *)&local_30,"%*sCONNECT payload\n",(ulong)(uint)indent,"");
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  MQTTStringPrintf((char *)local_50,"%*sClientID: ",(ulong)(local_1c + 2),"");
  Bstrlib::String::operator+=(pFStack_18,local_50);
  Bstrlib::String::~String(local_50);
  Common::DynamicString::dump(&this->clientID,pFStack_18,0);
  uVar1 = Common::BitField::operator_cast_to_unsigned_char
                    ((BitField *)&(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag)
  ;
  if (uVar1 != '\0') {
    WillMessage::dump(this->willMessage,pFStack_18,local_1c + 2);
  }
  MQTTStringPrintf((char *)&local_60,"%*sUsername: ",(ulong)(local_1c + 2),"");
  Bstrlib::String::operator+=(pFStack_18,&local_60);
  Bstrlib::String::~String(&local_60);
  Common::DynamicString::dump(&this->username,pFStack_18,0);
  MQTTStringPrintf((char *)&local_70,"%*sPassword: ",(ulong)(local_1c + 2),"");
  Bstrlib::String::operator+=(pFStack_18,&local_70);
  Bstrlib::String::~String(&local_70);
  Common::DynamicBinaryData::dump(&this->password,pFStack_18,0);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sCONNECT payload\n", (int)indent, "");
                    out += MQTTStringPrintf("%*sClientID: ", (int)indent + 2, ""); clientID.dump(out, 0);
                    if (fixedHeader->willFlag) willMessage->dump(out, indent + 2);  // Not testing pointer here, since it's a correctly constructed object is expected
                    out += MQTTStringPrintf("%*sUsername: ", (int)indent + 2, ""); username.dump(out, 0);
                    out += MQTTStringPrintf("%*sPassword: ", (int)indent + 2, ""); password.dump(out, 0);
                }